

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::WildcardPattern::~WildcardPattern(WildcardPattern *this)

{
  pointer pcVar1;
  
  this->_vptr_WildcardPattern = (_func_int **)&PTR__WildcardPattern_00167040;
  pcVar1 = (this->m_pattern)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_pattern).field_2) {
    operator_delete(pcVar1);
  }
  operator_delete(this);
  return;
}

Assistant:

WildcardPattern::~WildcardPattern() {}